

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand::RenderCommand(RenderCommand *this)

{
  (this->params).visibleFace = FACETYPE_LAST;
  (this->params).stencilTestEnabled = false;
  (this->params).stencil[0].function = 0;
  (this->params).stencil[0].reference = 0;
  (this->params).stencil[0].compareMask = 0;
  (this->params).stencil[0].stencilFailOp = 0;
  (this->params).stencil[0].depthFailOp = 0;
  (this->params).stencil[0].depthPassOp = 0;
  *(undefined8 *)&(this->params).stencil[0].writeMask = 0;
  (this->params).stencil[1].reference = 0;
  (this->params).stencil[1].compareMask = 0;
  (this->params).stencil[1].stencilFailOp = 0;
  (this->params).stencil[1].depthFailOp = 0;
  *(undefined8 *)((long)&(this->params).stencil[1].stencilFailOp + 1) = 0;
  *(undefined8 *)((long)&(this->params).stencil[1].depthPassOp + 1) = 0;
  (this->params).depthFunc = 0;
  (this->params).depth = 0.0;
  (this->params).depthWriteMask = false;
  (this->rect).left = 0;
  (this->rect).bottom = 0;
  (this->rect).width = 0;
  (this->rect).height = 0;
  tcu::Vector<float,_4>::Vector(&this->color);
  tcu::Vector<bool,_4>::Vector(&this->colorMask);
  return;
}

Assistant:

RenderCommand (void)
		: rect(0, 0, 0, 0)
	{
	}